

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

debugger_type * __thiscall
type_safe::basic_optional<type_safe::reference_optional_storage<debugger_type,_false>_>::value
          (basic_optional<type_safe::reference_optional_storage<debugger_type,_false>_> *this)

{
  storage *this_00;
  result_type pdVar1;
  char *local_28;
  undefined4 local_20;
  basic_optional<type_safe::reference_optional_storage<debugger_type,_false>_> *local_18;
  basic_optional<type_safe::reference_optional_storage<debugger_type,_false>_> *local_10;
  basic_optional<type_safe::reference_optional_storage<debugger_type,_false>_> *this_local;
  
  local_28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/optional.hpp"
  ;
  local_20 = 0x1b0;
  local_18 = this;
  local_10 = this;
  debug_assert::detail::
  do_assert<type_safe::basic_optional<type_safe::reference_optional_storage<debugger_type,false>>::value()const&::_lambda()_1_,type_safe::detail::precondition_error_handler>
            (&local_18,&local_28,"has_value()");
  this_00 = get_storage(this);
  pdVar1 = reference_optional_storage<debugger_type,_false>::get_value(this_00);
  return pdVar1;
}

Assistant:

auto value() const TYPE_SAFE_LVALUE_REF noexcept
        -> decltype(std::declval<const storage&>().get_value())
    {
        DEBUG_ASSERT(has_value(), detail::precondition_error_handler{});
        return get_storage().get_value();
    }